

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

SyntaxKind slang::syntax::SyntaxFacts::getModuleHeaderKind(TokenKind kind)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,kind);
  if (iVar1 < 0xd9) {
    if (iVar1 == 200) {
      return InterfaceHeader;
    }
    if (iVar1 == 0xd5) {
      return ModuleHeader;
    }
  }
  else {
    if (iVar1 == 0xd9) {
      return ModuleHeader;
    }
    if (iVar1 == 0xe8) {
      return PackageHeader;
    }
    if (iVar1 == 0xef) {
      return ProgramHeader;
    }
  }
  return Unknown;
}

Assistant:

SyntaxKind SyntaxFacts::getModuleHeaderKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::MacromoduleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::ProgramKeyword: return SyntaxKind::ProgramHeader;
        case TokenKind::InterfaceKeyword: return SyntaxKind::InterfaceHeader;
        case TokenKind::PackageKeyword: return SyntaxKind::PackageHeader;
        default: return SyntaxKind::Unknown;
    }
}